

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lambdamember.cpp
# Opt level: O1

PyObject * PyInit_member(void)

{
  PyObject *pPVar1;
  handle hVar2;
  int iVar3;
  undefined8 uVar4;
  class_<SomeClass> *pcVar5;
  function_record *rec;
  cpp_function cf;
  module m;
  int minor;
  int major;
  descr<14UL,_1UL> signature;
  cpp_function local_90;
  handle local_88;
  handle local_80;
  class_<SomeClass> local_78;
  cpp_function local_70;
  handle local_68;
  int local_60;
  int local_5c;
  code *local_58;
  undefined8 local_50;
  undefined8 local_48;
  handle hStack_40;
  handle local_38;
  object aoStack_30 [2];
  
  uVar4 = Py_GetVersion();
  iVar3 = __isoc99_sscanf(uVar4,"%i.%i",&local_5c,&local_60);
  if (iVar3 == 2) {
    if (local_60 == 10 && local_5c == 3) {
      pybind11::module::module
                ((module *)&local_68,"lambdamember",
                 "pybind11 member class with lambda function example");
      pybind11::class_<SomeClass>::class_<>(&local_78,local_68,"SomeClass");
      pybind11::class_<SomeClass>::
      def<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_shibasisp[P]pybind11_examples_pybind11_include_pybind11_pybind11_h:1295:28)>
                (&local_78,"__init__",(type *)&local_48);
      pcVar5 = pybind11::class_<SomeClass>::def_readwrite<SomeClass,std::__cxx11::string>
                         (&local_78,"name",0);
      local_58 = SomeClass::getNumber;
      local_50 = 0;
      pybind11::cpp_function::cpp_function<void,SomeClass,double>
                (&local_70,(offset_in_SomeClass_to_subr)SomeClass::setNumber);
      pcVar5 = pybind11::class_<SomeClass>::def_property<double(SomeClass::*)()const>
                         (pcVar5,"number",(offset_in_SomeClass_to_subr *)&local_58,&local_70);
      pPVar1 = (pcVar5->super_generic_type).super_object.super_handle.m_ptr;
      local_90.super_function.super_object.super_handle.m_ptr = (function)&_Py_NoneStruct;
      __Py_NoneStruct = __Py_NoneStruct + 1;
      local_80.m_ptr = (PyObject *)PyObject_GetAttrString(pPVar1,"__repr__");
      if (local_80.m_ptr == (PyObject *)0x0) {
        PyErr_Clear();
        local_80.m_ptr = (PyObject *)&_Py_NoneStruct;
        __Py_NoneStruct = __Py_NoneStruct + 1;
      }
      hVar2.m_ptr = local_80.m_ptr;
      local_88.m_ptr = (PyObject *)0x0;
      rec = pybind11::cpp_function::make_function_record((cpp_function *)&local_88);
      rec->impl = pybind11::cpp_function::
                  initialize<pybind11_init()::$_0,std::__cxx11::string,SomeClass_const&,pybind11::name,pybind11::is_method,pybind11::sibling>(pybind11_init()::$_0&&,std::__cxx11::string(*)(SomeClass_const&),pybind11::name_const&,pybind11::is_method_const&,pybind11::sibling_const&)
                  ::{lambda(pybind11::detail::function_call&)#1}::function_call__;
      rec->name = "__repr__";
      rec->field_0x59 = rec->field_0x59 | 0x20;
      (rec->scope).m_ptr = pPVar1;
      (rec->sibling).m_ptr = hVar2.m_ptr;
      local_38.m_ptr = (PyObject *)&SomeClass::typeinfo;
      aoStack_30[0].super_handle.m_ptr = (handle)(PyObject *)0x0;
      local_48._0_1_ = '(';
      local_48._1_1_ = '{';
      local_48._2_1_ = '%';
      local_48._3_1_ = '}';
      local_48._4_1_ = ')';
      local_48._5_1_ = ' ';
      local_48._6_1_ = '-';
      local_48._7_1_ = '>';
      hStack_40.m_ptr = (PyObject *)0x7d7274737b20;
      pybind11::cpp_function::initialize_generic
                ((cpp_function *)&local_88,rec,(char *)&local_48,(type_info **)&local_38,1);
      pybind11::object::~object((object *)&local_80);
      pybind11::object::~object((object *)&local_90);
      pybind11::cpp_function::name(&local_90);
      hStack_40.m_ptr = (pcVar5->super_generic_type).super_object.super_handle.m_ptr;
      if ((object)local_90.super_function.super_object.super_handle.m_ptr != (PyObject *)0x0) {
        *(long *)local_90.super_function.super_object.super_handle.m_ptr =
             *(long *)local_90.super_function.super_object.super_handle.m_ptr + 1;
      }
      local_38.m_ptr = (PyObject *)local_90.super_function.super_object.super_handle.m_ptr;
      local_80.m_ptr = (PyObject *)0x0;
      aoStack_30[0].super_handle.m_ptr = (handle)(PyObject *)0x0;
      pybind11::object::~object((object *)&local_80);
      pybind11::detail::accessor_policies::obj_attr::set(hStack_40,local_38,local_88);
      pybind11::object::~object(aoStack_30);
      pybind11::object::~object((object *)&local_38);
      pybind11::object::~object((object *)&local_90);
      pybind11::object::~object((object *)&local_88);
      pybind11::object::~object((object *)&local_70);
      pybind11::object::~object((object *)&local_78);
      pybind11::object::~object((object *)&local_68);
    }
    else {
      PyErr_Format(_PyExc_ImportError,
                   "Python version mismatch: module was compiled for version %i.%i, while the interpreter is running version %i.%i."
                   ,3,10);
      local_68.m_ptr = (PyObject *)0x0;
    }
  }
  else {
    PyErr_SetString(_PyExc_ImportError,"Can\'t parse Python version.");
    local_68.m_ptr = (PyObject *)0x0;
  }
  return local_68.m_ptr;
}

Assistant:

PYBIND11_PLUGIN(member)
{
    py::module m("lambdamember","pybind11 member class with lambda function example");

    py::class_<SomeClass>( m, "SomeClass")
        .def(py::init<std::string>())
        .def_readwrite("name", & SomeClass::name)
        .def_property("number", &SomeClass::getNumber, &SomeClass::setNumber)
        .def("__repr__",
            [](const SomeClass &a) {
            return "<example.SomeClass named '" + a.name + "'>";
            });
    ;
    return m.ptr();

}